

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

int EVP_EncodedLength(size_t *out_len,size_t len)

{
  ulong uVar1;
  size_t len_local;
  size_t *out_len_local;
  
  if (len + 2 < len) {
    out_len_local._4_4_ = 0;
  }
  else {
    uVar1 = (len + 2) / 3;
    if ((uVar1 & 0x3fffffffffffffff) == uVar1) {
      uVar1 = uVar1 * 4;
      if (uVar1 + 1 < uVar1) {
        out_len_local._4_4_ = 0;
      }
      else {
        *out_len = uVar1 + 1;
        out_len_local._4_4_ = 1;
      }
    }
    else {
      out_len_local._4_4_ = 0;
    }
  }
  return out_len_local._4_4_;
}

Assistant:

int EVP_EncodedLength(size_t *out_len, size_t len) {
  if (len + 2 < len) {
    return 0;
  }
  len += 2;
  len /= 3;

  if (((len << 2) >> 2) != len) {
    return 0;
  }
  len <<= 2;

  if (len + 1 < len) {
    return 0;
  }
  len++;

  *out_len = len;
  return 1;
}